

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O1

Vec_Ptr_t * Nwk_ManDeriveRetimingCut(Aig_Man_t *p,int fForward,int fVerbose)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  Nwk_Man_t *pMan;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  
  pMan = Nwk_ManDeriveFromAig(p);
  if (fForward == 0) {
    pVVar4 = Nwk_ManRetimeCutBackward(pMan,p->nRegs,fVerbose);
  }
  else {
    pVVar4 = Nwk_ManRetimeCutForward(pMan,p->nRegs,fVerbose);
  }
  lVar5 = (long)p->vObjs->nSize;
  if (0 < lVar5) {
    ppvVar2 = p->vObjs->pArray;
    lVar6 = 0;
    do {
      pvVar3 = ppvVar2[lVar6];
      if (pvVar3 != (void *)0x0) {
        *(void **)(*(long *)((long)pvVar3 + 0x28) + 0x10) = pvVar3;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  iVar1 = pVVar4->nSize;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      pVVar4->pArray[lVar5] = *(void **)((long)pVVar4->pArray[lVar5] + 0x10);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  Nwk_ManFree(pMan);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Nwk_ManDeriveRetimingCut( Aig_Man_t * p, int fForward, int fVerbose )
{ 
    Vec_Ptr_t * vNodes;
    Nwk_Man_t * pNtk;
    Nwk_Obj_t * pNode;
    Aig_Obj_t * pObj;
    int i;
    pNtk = Nwk_ManDeriveFromAig( p );
    if ( fForward )
        vNodes = Nwk_ManRetimeCutForward( pNtk, Aig_ManRegNum(p), fVerbose );
    else
        vNodes = Nwk_ManRetimeCutBackward( pNtk, Aig_ManRegNum(p), fVerbose );
    Aig_ManForEachObj( p, pObj, i )
        ((Nwk_Obj_t *)pObj->pData)->pCopy = pObj;
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pNode, i )
        Vec_PtrWriteEntry( vNodes, i, pNode->pCopy );
    Nwk_ManFree( pNtk );
//    assert( Vec_PtrSize(vNodes) <= Aig_ManRegNum(p) );
    return vNodes;
}